

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O2

void helics::helicsGetComplexVector
               (string_view val,
               vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *data)

{
  value_t vVar1;
  pointer pcVar2;
  double dVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  int iVar7;
  size_type sVar8;
  size_type sVar9;
  size_type sVar10;
  reference this;
  size_type sVar11;
  reference pvVar12;
  char *pcVar13;
  char *extraout_RDX;
  bool bVar14;
  double dVar15;
  string_view val_00;
  string_view val_01;
  string_view val_02;
  string_view val_03;
  string_view trimCharacters;
  string_view trimCharacters_00;
  string_view jsonString;
  basic_string_view<char,_std::char_traits<char>_> bVar16;
  string_view val_local;
  double local_a8;
  int local_9c;
  double val2;
  undefined8 uStack_90;
  double val1;
  basic_string_view<char,_std::char_traits<char>_> vstr1;
  basic_string_view<char,_std::char_traits<char>_> vstr2;
  
  val_00._M_len = val._M_str;
  val_local._M_len = val._M_len;
  val_local._M_str = val_00._M_len;
  if ((helics *)val_local._M_len == (helics *)0x0) {
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(data,0);
    return;
  }
  if (*val_00._M_len == 'c') {
    val_01._M_str = (char *)data;
    val_01._M_len = (size_t)val_00._M_len;
    iVar7 = readSize((helics *)val_local._M_len,val_01);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
              (data,(long)iVar7);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(data,0);
    sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      ((basic_string_view<char,_std::char_traits<char>_> *)&val_local,'[',0);
    iVar6 = 0;
    if (0 < iVar7) {
      iVar6 = iVar7;
    }
    while (bVar14 = iVar6 != 0, iVar6 = iVar6 + -1, bVar14) {
      sVar9 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)&val_local,",;]",
                         sVar8 + 1);
      bVar16 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)&val_local,sVar8 + 1,
                          ~sVar8 + sVar9);
      val_02._M_str = bVar16._M_str;
      val_02._M_len = (size_t)val_02._M_str;
      helicsGetComplex((helics *)bVar16._M_len,val_02);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::push_back
                (data,(value_type *)&vstr1);
      sVar8 = sVar9;
    }
  }
  else if (*val_00._M_len == 'v') {
    val_00._M_str = (char *)data;
    iVar6 = readSize((helics *)val_local._M_len,val_00);
    pcVar13 = (char *)0x2;
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
              (data,(long)(iVar6 / 2));
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(data,0);
    sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      ((basic_string_view<char,_std::char_traits<char>_> *)&val_local,'[',0);
    local_9c = iVar6 + -1;
    for (iVar6 = 0; iVar6 < local_9c; iVar6 = iVar6 + 2) {
      sVar9 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)&val_local,",;]",
                         sVar8 + 1);
      sVar10 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                         ((basic_string_view<char,_std::char_traits<char>_> *)&val_local,",;]",
                          sVar9 + 1);
      vstr1 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)&val_local,sVar8 + 1,
                         ~sVar8 + sVar9);
      trimCharacters._M_str = pcVar13;
      trimCharacters._M_len = (size_t)" \t\n\r";
      gmlc::utilities::string_viewOps::trimString
                ((string_viewOps *)&vstr1,(string_view *)0x4,trimCharacters);
      vstr2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)&val_local,sVar9 + 1,
                         sVar10 + ~sVar9);
      trimCharacters_00._M_str = pcVar13;
      trimCharacters_00._M_len = (size_t)" \t\n\r";
      gmlc::utilities::string_viewOps::trimString
                ((string_viewOps *)&vstr2,(string_view *)0x4,trimCharacters_00);
      val1 = gmlc::utilities::numConv<double>(vstr1);
      val2 = gmlc::utilities::numConv<double>(vstr2);
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      emplace_back<double&,double&>
                ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)data,&val1,
                 &val2);
      sVar8 = sVar9;
    }
  }
  else {
    sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      ((basic_string_view<char,_std::char_traits<char>_> *)&val_local,"ji",0);
    if (sVar8 == 0xffffffffffffffff) {
      jsonString._M_str = (char *)val_local._M_len;
      jsonString._M_len = (size_t)&val1;
      fileops::loadJsonStr_abi_cxx11_(jsonString);
      if (val1._0_1_ - 5 < 3) {
        std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(data,0);
        vstr1._M_len = (size_t)nlohmann::json_abi_v3_11_3::
                               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               ::get_impl<double,_0>
                                         ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                           *)&val1);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = vstr2._M_str;
        vstr2 = (basic_string_view<char,_std::char_traits<char>_>)(auVar4 << 0x40);
        std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
        emplace_back<double,double>
                  ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)data,
                   (double *)&vstr1,(double *)&vstr2);
      }
      else if (val1._0_1_ == 2) {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::begin((iterator *)&vstr1,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)&val1);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::end((iterator *)&vstr2,
              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)&val1);
        bVar14 = false;
        while( true ) {
          bVar5 = nlohmann::json_abi_v3_11_3::detail::
                  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::
                  operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                            ((iterator *)&vstr1,(iterator *)&vstr2);
          if (!bVar5) break;
          this = nlohmann::json_abi_v3_11_3::detail::
                 iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 ::operator*((iterator *)&vstr1);
          vVar1 = (this->m_data).m_type;
          if ((byte)(vVar1 - number_integer) < 3) {
            if (bVar14) {
              dVar15 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       ::get_impl<double,_0>(this);
              pcVar2 = (data->
                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              dVar3 = *(double *)(pcVar2[-1]._M_value + 8);
              *(double *)pcVar2[-1]._M_value = *(double *)pcVar2[-1]._M_value + 0.0;
              *(double *)(pcVar2[-1]._M_value + 8) = dVar15 + dVar3;
LAB_001e6230:
              bVar14 = false;
            }
            else {
              val2 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::get_impl<double,_0>(this);
              local_a8 = 0.0;
              std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
              emplace_back<double,double>
                        ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)data,
                         &val2,&local_a8);
              bVar14 = true;
            }
          }
          else if (vVar1 == array) {
            sVar11 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::size(this);
            if (sVar11 < 2) {
              sVar11 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       ::size(this);
              if (sVar11 != 1) {
                val2 = -1e+49;
                uStack_90 = 0;
                std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
                emplace_back<std::complex<double>>
                          ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)data
                           ,(complex<double> *)&val2);
                goto LAB_001e6230;
              }
              pvVar12 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::operator[](this,0);
              bVar14 = false;
              if ((byte)((pvVar12->m_data).m_type - number_integer) < 3) {
                pvVar12 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::operator[](this,0);
                val2 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       ::get_impl<double,_0>(pvVar12);
                local_a8 = 0.0;
                std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
                emplace_back<double,double>
                          ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)data
                           ,&val2,&local_a8);
              }
            }
            else {
              pvVar12 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::operator[](this,0);
              bVar14 = false;
              if ((byte)((pvVar12->m_data).m_type - number_integer) < 3) {
                pvVar12 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::operator[](this,0);
                val2 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       ::get_impl<double,_0>(pvVar12);
                pvVar12 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::operator[](this,1);
                local_a8 = nlohmann::json_abi_v3_11_3::
                           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           ::get_impl<double,_0>(pvVar12);
                std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
                emplace_back<double,double>
                          ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)data
                           ,&val2,&local_a8);
              }
            }
          }
          nlohmann::json_abi_v3_11_3::detail::
          iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
          ::operator++((iterator *)&vstr1);
        }
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&val1);
    }
    else {
      val_03._M_str = extraout_RDX;
      val_03._M_len = (size_t)val_local._M_str;
      helicsGetComplex((helics *)val_local._M_len,val_03);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(data,0);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::push_back
                (data,(value_type *)&vstr1);
    }
  }
  return;
}

Assistant:

void helicsGetComplexVector(std::string_view val, std::vector<std::complex<double>>& data)
{
    if (val.empty()) {
        data.resize(0);
        return;
    }
    if (val.front() == 'v') {
        auto size = readSize(val);
        data.reserve(size / 2);
        data.resize(0);
        auto firstBracket = val.find_first_of('[');
        for (decltype(size) ii = 0; ii < size - 1; ii += 2) {
            auto nextChar = val.find_first_of(",;]", firstBracket + 1);
            auto secondChar = val.find_first_of(",;]", nextChar + 1);
            try {
                auto vstr1 = val.substr(firstBracket + 1, nextChar - firstBracket - 1);
                string_viewOps::trimString(vstr1);
                auto vstr2 = val.substr(nextChar + 1, secondChar - nextChar - 1);
                string_viewOps::trimString(vstr2);
                auto val1 = numConv<double>(vstr1);
                auto val2 = numConv<double>(vstr2);
                data.emplace_back(val1, val2);
            }
            catch (const std::invalid_argument&) {
                data.push_back(invalidValue<std::complex<double>>());
            }
            firstBracket = nextChar;
        }
    } else if (val.front() == 'c') {
        auto size = readSize(val);
        data.reserve(size);
        data.resize(0);
        auto firstBracket = val.find_first_of('[');
        for (decltype(size) ii = 0; ii < size; ++ii) {
            auto nextChar = val.find_first_of(",;]", firstBracket + 1);
            auto cval = helicsGetComplex(val.substr(firstBracket + 1, nextChar - firstBracket - 1));
            data.push_back(cval);
            firstBracket = nextChar;
        }
    } else {
        if (val.find_first_of("ji") != std::string_view::npos) {
            auto cval = helicsGetComplex(val);
            data.resize(0);
            data.push_back(cval);
        } else {
            auto json = fileops::loadJsonStr(val);
            int cnt{0};
            switch (json.type()) {
                case nlohmann::json::value_t::number_float:
                case nlohmann::json::value_t::number_integer:
                case nlohmann::json::value_t::number_unsigned:
                    data.resize(0);
                    data.emplace_back(json.get<double>(), 0.0);
                    break;
                case nlohmann::json::value_t::array:
                    for (auto& aval : json) {
                        if (aval.is_number()) {
                            if (cnt == 0) {
                                data.emplace_back(aval.get<double>(), 0.0);
                                cnt = 1;
                            } else {
                                data.back() += std::complex<double>{0.0, aval.get<double>()};
                                cnt = 0;
                            }
                        } else if (aval.is_array()) {
                            cnt = 0;
                            if (aval.size() >= 2) {
                                if (aval[0].is_number()) {
                                    data.emplace_back(aval[0].get<double>(), aval[1].get<double>());
                                }
                            } else if (aval.size() == 1) {
                                if (aval[0].is_number()) {
                                    data.emplace_back(aval[0].get<double>(), 0.0);
                                }
                            } else {
                                data.push_back(invalidValue<std::complex<double>>());
                            }
                        }
                    }
                    break;
                default:
                    break;
            }
        }
    }
}